

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O3

bool __thiscall absl::Mutex::ReaderTryLock(Mutex *this)

{
  ulong uVar1;
  ulong uVar2;
  GraphId id;
  SynchLocksHeld *held_locks;
  int iVar3;
  bool bVar4;
  
  uVar2 = (this->mu_).super___atomic_base<long>._M_i;
  if ((uVar2 & 0x1c) == 0) {
    iVar3 = -4;
    uVar1 = uVar2;
    do {
      LOCK();
      uVar2 = (this->mu_).super___atomic_base<long>._M_i;
      bVar4 = uVar1 == uVar2;
      if (bVar4) {
        (this->mu_).super___atomic_base<long>._M_i = (uVar1 | 1) + 0x100;
        uVar2 = uVar1;
      }
      UNLOCK();
      if (bVar4) {
        if (_ZN4absl12_GLOBAL__N_124synch_deadlock_detectionE_0 == 0) {
          return true;
        }
        id = GetGraphId(this);
        held_locks = Synch_GetAllLocks();
        LockEnter(this,id,held_locks);
        return true;
      }
    } while ((iVar3 != 0) && (iVar3 = iVar3 + 1, uVar1 = uVar2, (uVar2 & 0x1c) == 0));
  }
  if ((uVar2 & 0x10) == 0) {
    return false;
  }
  bVar4 = ReaderTryLockSlow(this);
  return bVar4;
}

Assistant:

bool Mutex::ReaderTryLock() {
  ABSL_TSAN_MUTEX_PRE_LOCK(this,
                           __tsan_mutex_read_lock | __tsan_mutex_try_lock);
  intptr_t v = mu_.load(std::memory_order_relaxed);
  // Clang tends to unroll the loop when compiling with optimization.
  // But in this case it just unnecessary increases code size.
  // If CAS is failing due to contention, the jump cost is negligible.
#if defined(__clang__)
#pragma nounroll
#endif
  // The while-loops (here and below) iterate only if the mutex word keeps
  // changing (typically because the reader count changes) under the CAS.
  // We limit the number of attempts to avoid having to think about livelock.
  for (int loop_limit = 5; loop_limit != 0; loop_limit--) {
    if (ABSL_PREDICT_FALSE((v & (kMuWriter | kMuWait | kMuEvent)) != 0)) {
      break;
    }
    if (ABSL_PREDICT_TRUE(mu_.compare_exchange_strong(
            v, (kMuReader | v) + kMuOne, std::memory_order_acquire,
            std::memory_order_relaxed))) {
      DebugOnlyLockEnter(this);
      ABSL_TSAN_MUTEX_POST_LOCK(
          this, __tsan_mutex_read_lock | __tsan_mutex_try_lock, 0);
      return true;
    }
  }
  if (ABSL_PREDICT_TRUE((v & kMuEvent) == 0)) {
    ABSL_TSAN_MUTEX_POST_LOCK(this,
                              __tsan_mutex_read_lock | __tsan_mutex_try_lock |
                                  __tsan_mutex_try_lock_failed,
                              0);
    return false;
  }
  // we're recording events
  return ReaderTryLockSlow();
}